

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void selectInnerLoop(Parse *pParse,Select *p,ExprList *pEList,int srcTab,int nColumn,
                    ExprList *pOrderBy,DistinctCtx *pDistinct,SelectDest *pDest,int iContinue,
                    int iBreak)

{
  u8 uVar1;
  Vdbe *v;
  byte bVar2;
  char cVar3;
  int iVar4;
  Op *pOVar5;
  CollSeq *zP4;
  int p2;
  int p1;
  int iVar6;
  long lVar7;
  int iVar8;
  int op;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  ulong local_80;
  
  v = pParse->pVdbe;
  if (v == (Vdbe *)0x0) {
    return;
  }
  if (pDistinct == (DistinctCtx *)0x0) {
    bVar11 = false;
  }
  else {
    bVar11 = pDistinct->eTnctType != '\0';
  }
  uVar1 = pDest->eDest;
  p1 = pDest->iSDParm;
  if (pOrderBy == (ExprList *)0x0 && !bVar11) {
    codeOffset(v,p,iContinue);
  }
  local_80 = (ulong)(uint)nColumn;
  if (nColumn < 1) {
    local_80 = (ulong)(uint)pEList->nExpr;
  }
  iVar8 = (int)local_80;
  if (pDest->iSdst == 0) {
    iVar6 = pParse->nMem;
    pDest->iSdst = iVar6 + 1;
    pDest->nSdst = iVar8;
    pParse->nMem = iVar6 + iVar8;
  }
  iVar6 = pDest->iSdst;
  if (nColumn < 1) {
    if (uVar1 != '\x03') {
      sqlite3ExprCacheClear(pParse);
      sqlite3ExprCodeExprList(pParse,pEList,iVar6,(uint)(uVar1 == '\x05'));
    }
  }
  else {
    iVar10 = 0;
    do {
      sqlite3VdbeAddOp3(v,0x1d,srcTab,iVar10,iVar10 + iVar6);
      iVar10 = iVar10 + 1;
    } while (nColumn != iVar10);
  }
  if (bVar11) {
    if (pDistinct->eTnctType == '\x01') {
      sqlite3VdbeChangeToNoop(v,pDistinct->addrTnct);
    }
    else if (pDistinct->eTnctType == '\x02') {
      iVar10 = pParse->nMem;
      pParse->nMem = iVar8 + iVar10;
      sqlite3VdbeChangeToNoop(v,pDistinct->addrTnct);
      iVar4 = pDistinct->addrTnct;
      if (iVar4 < 0) {
        iVar4 = v->nOp + -1;
      }
      iVar10 = iVar10 + 1;
      if (v->db->mallocFailed == '\0') {
        pOVar5 = v->aOp + iVar4;
      }
      else {
        pOVar5 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar5->opcode = '\n';
      pOVar5->p1 = 1;
      pOVar5->p2 = iVar10;
      if (0 < iVar8) {
        iVar4 = v->nOp;
        uVar9 = 0;
        do {
          zP4 = sqlite3ExprCollSeq(pParse,pEList->a[uVar9].pExpr);
          if ((long)uVar9 < (long)(iVar8 + -1)) {
            op = 0x4b;
            p2 = iVar4 + iVar8;
          }
          else {
            op = 0x4c;
            p2 = iContinue;
          }
          sqlite3VdbeAddOp3(v,op,iVar6 + (int)uVar9,p2,iVar10 + (int)uVar9);
          sqlite3VdbeChangeP4(v,-1,(char *)zP4,-4);
          if (v->aOp != (Op *)0x0) {
            v->aOp[(long)v->nOp + -1].p5 = 0x80;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != local_80);
      }
      sqlite3VdbeAddOp3(v,0xe,iVar6,iVar10,iVar8 + -1);
    }
    else {
      codeDistinct(pParse,pDistinct->tabTnct,iContinue,iVar8,iVar6);
    }
    if (pOrderBy == (ExprList *)0x0) {
      codeOffset(v,p,iContinue);
    }
  }
  switch(uVar1) {
  case '\x01':
    if (pParse->nTempReg == '\0') {
      iVar10 = pParse->nMem + 1;
      pParse->nMem = iVar10;
    }
    else {
      bVar2 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar2;
      iVar10 = pParse->aTempReg[bVar2];
    }
    sqlite3VdbeAddOp3(v,0x1f,iVar6,iVar8,iVar10);
    sqlite3VdbeAddOp3(v,0x61,p1,iVar10,0);
    if ((iVar10 == 0) || (uVar9 = (ulong)pParse->nTempReg, 7 < uVar9))
    goto switchD_00163b0b_caseD_4;
    lVar7 = 0;
    do {
      if (*(int *)((long)&pParse->aColCache[0].iReg + lVar7) == iVar10) goto LAB_00163f2b;
      lVar7 = lVar7 + 0x18;
    } while ((int)lVar7 != 0xf0);
    break;
  case '\x02':
    iVar4 = 0x62;
    goto LAB_00163c34;
  case '\x03':
    iVar4 = 7;
    iVar10 = 1;
LAB_00163c31:
    iVar8 = 0;
    iVar6 = p1;
    p1 = iVar10;
LAB_00163c34:
    sqlite3VdbeAddOp3(v,iVar4,p1,iVar6,iVar8);
  default:
    goto switchD_00163b0b_caseD_4;
  case '\x05':
  case '\n':
    if (pOrderBy == (ExprList *)0x0) {
      if (uVar1 != '\n') {
        sqlite3VdbeAddOp3(v,0x10,iVar6,iVar8,0);
        sqlite3ExprCacheRemove(pParse,iVar6,iVar8);
        goto switchD_00163b0b_caseD_4;
      }
      iVar10 = pDest->iSDParm;
      iVar4 = 4;
      p1 = 0;
      goto LAB_00163c31;
    }
    if (pParse->nTempReg == '\0') {
      iVar10 = pParse->nMem + 1;
      pParse->nMem = iVar10;
    }
    else {
      bVar2 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar2;
      iVar10 = pParse->aTempReg[bVar2];
    }
    sqlite3VdbeAddOp3(v,0x1f,iVar6,iVar8,iVar10);
    pushOntoSorter(pParse,pOrderBy,p,iVar10);
    if ((iVar10 == 0) || (uVar9 = (ulong)pParse->nTempReg, 7 < uVar9))
    goto switchD_00163b0b_caseD_4;
    lVar7 = 0;
    do {
      if (*(int *)((long)&pParse->aColCache[0].iReg + lVar7) == iVar10) goto LAB_00163f2b;
      lVar7 = lVar7 + 0x18;
    } while ((int)lVar7 != 0xf0);
    break;
  case '\x06':
    if (pOrderBy == (ExprList *)0x0) {
      sqlite3ExprCodeMove(pParse,iVar6,p1,1);
      goto switchD_00163b0b_caseD_4;
    }
LAB_00163c02:
    pushOntoSorter(pParse,pOrderBy,p,iVar6);
    goto switchD_00163b0b_caseD_4;
  case '\a':
    cVar3 = sqlite3CompareAffinity(pEList->a->pExpr,pDest->affSdst);
    pDest->affSdst = cVar3;
    if (pOrderBy != (ExprList *)0x0) goto LAB_00163c02;
    if (pParse->nTempReg == '\0') {
      iVar10 = pParse->nMem + 1;
      pParse->nMem = iVar10;
    }
    else {
      bVar2 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar2;
      iVar10 = pParse->aTempReg[bVar2];
    }
    iVar8 = sqlite3VdbeAddOp3(v,0x1f,iVar6,1,iVar10);
    sqlite3VdbeChangeP4(v,iVar8,&pDest->affSdst,1);
    sqlite3ExprCacheRemove(pParse,iVar6,1);
    sqlite3VdbeAddOp3(v,0x61,p1,iVar10,0);
    if ((iVar10 == 0) || (uVar9 = (ulong)pParse->nTempReg, 7 < uVar9))
    goto switchD_00163b0b_caseD_4;
    lVar7 = 0;
    do {
      if (*(int *)((long)&pParse->aColCache[0].iReg + lVar7) == iVar10) goto LAB_00163f2b;
      lVar7 = lVar7 + 0x18;
    } while ((int)lVar7 != 0xf0);
    break;
  case '\b':
  case '\t':
    if (pParse->nTempReg == '\0') {
      iVar10 = pParse->nMem + 1;
      pParse->nMem = iVar10;
    }
    else {
      bVar2 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar2;
      iVar10 = pParse->aTempReg[bVar2];
    }
    sqlite3VdbeAddOp3(v,0x1f,iVar6,iVar8,iVar10);
    if (pOrderBy == (ExprList *)0x0) {
      if (pParse->nTempReg == '\0') {
        iVar8 = pParse->nMem + 1;
        pParse->nMem = iVar8;
      }
      else {
        bVar2 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar2;
        iVar8 = pParse->aTempReg[bVar2];
      }
      sqlite3VdbeAddOp3(v,0x38,p1,iVar8,0);
      sqlite3VdbeAddOp3(v,0x39,p1,iVar10,iVar8);
      if (v->aOp != (Op *)0x0) {
        v->aOp[(long)v->nOp + -1].p5 = '\b';
      }
      if (iVar8 != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          lVar7 = 0;
          do {
            if (*(int *)((long)&pParse->aColCache[0].iReg + lVar7) == iVar8) {
              (&pParse->aColCache[0].tempReg)[lVar7] = '\x01';
              goto LAB_00163c7a;
            }
            lVar7 = lVar7 + 0x18;
          } while ((int)lVar7 != 0xf0);
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = iVar8;
        }
      }
    }
    else {
      pushOntoSorter(pParse,pOrderBy,p,iVar10);
    }
LAB_00163c7a:
    if ((iVar10 == 0) || (uVar9 = (ulong)pParse->nTempReg, 7 < uVar9))
    goto switchD_00163b0b_caseD_4;
    lVar7 = 0;
    do {
      if (*(int *)((long)&pParse->aColCache[0].iReg + lVar7) == iVar10) goto LAB_00163f2b;
      lVar7 = lVar7 + 0x18;
    } while ((int)lVar7 != 0xf0);
  }
  pParse->nTempReg = (char)uVar9 + '\x01';
  pParse->aTempReg[uVar9] = iVar10;
switchD_00163b0b_caseD_4:
  if ((pOrderBy == (ExprList *)0x0) && (p->iLimit != 0)) {
    sqlite3VdbeAddOp3(v,0x7a,p->iLimit,iBreak,-1);
    return;
  }
  return;
LAB_00163f2b:
  (&pParse->aColCache[0].tempReg)[lVar7] = '\x01';
  goto switchD_00163b0b_caseD_4;
}

Assistant:

static void selectInnerLoop(
  Parse *pParse,          /* The parser context */
  Select *p,              /* The complete select statement being coded */
  ExprList *pEList,       /* List of values being extracted */
  int srcTab,             /* Pull data from this table */
  int nColumn,            /* Number of columns in the source table */
  ExprList *pOrderBy,     /* If not NULL, sort results using this key */
  DistinctCtx *pDistinct, /* If not NULL, info on how to process DISTINCT */
  SelectDest *pDest,      /* How to dispose of the results */
  int iContinue,          /* Jump here to continue with next row */
  int iBreak              /* Jump here to break out of the inner loop */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  int hasDistinct;        /* True if the DISTINCT keyword is present */
  int regResult;              /* Start of memory holding result set */
  int eDest = pDest->eDest;   /* How to dispose of results */
  int iParm = pDest->iSDParm; /* First argument to disposal method */
  int nResultCol;             /* Number of result columns */

  assert( v );
  if( NEVER(v==0) ) return;
  assert( pEList!=0 );
  hasDistinct = pDistinct ? pDistinct->eTnctType : WHERE_DISTINCT_NOOP;
  if( pOrderBy==0 && !hasDistinct ){
    codeOffset(v, p, iContinue);
  }

  /* Pull the requested columns.
  */
  if( nColumn>0 ){
    nResultCol = nColumn;
  }else{
    nResultCol = pEList->nExpr;
  }
  if( pDest->iSdst==0 ){
    pDest->iSdst = pParse->nMem+1;
    pDest->nSdst = nResultCol;
    pParse->nMem += nResultCol;
  }else{ 
    assert( pDest->nSdst==nResultCol );
  }
  regResult = pDest->iSdst;
  if( nColumn>0 ){
    for(i=0; i<nColumn; i++){
      sqlite3VdbeAddOp3(v, OP_Column, srcTab, i, regResult+i);
    }
  }else if( eDest!=SRT_Exists ){
    /* If the destination is an EXISTS(...) expression, the actual
    ** values returned by the SELECT are not required.
    */
    sqlite3ExprCacheClear(pParse);
    sqlite3ExprCodeExprList(pParse, pEList, regResult, eDest==SRT_Output);
  }
  nColumn = nResultCol;

  /* If the DISTINCT keyword was present on the SELECT statement
  ** and this row has been seen before, then do not make this row
  ** part of the result.
  */
  if( hasDistinct ){
    assert( pEList!=0 );
    assert( pEList->nExpr==nColumn );
    switch( pDistinct->eTnctType ){
      case WHERE_DISTINCT_ORDERED: {
        VdbeOp *pOp;            /* No longer required OpenEphemeral instr. */
        int iJump;              /* Jump destination */
        int regPrev;            /* Previous row content */

        /* Allocate space for the previous row */
        regPrev = pParse->nMem+1;
        pParse->nMem += nColumn;

        /* Change the OP_OpenEphemeral coded earlier to an OP_Null
        ** sets the MEM_Cleared bit on the first register of the
        ** previous value.  This will cause the OP_Ne below to always
        ** fail on the first iteration of the loop even if the first
        ** row is all NULLs.
        */
        sqlite3VdbeChangeToNoop(v, pDistinct->addrTnct);
        pOp = sqlite3VdbeGetOp(v, pDistinct->addrTnct);
        pOp->opcode = OP_Null;
        pOp->p1 = 1;
        pOp->p2 = regPrev;

        iJump = sqlite3VdbeCurrentAddr(v) + nColumn;
        for(i=0; i<nColumn; i++){
          CollSeq *pColl = sqlite3ExprCollSeq(pParse, pEList->a[i].pExpr);
          if( i<nColumn-1 ){
            sqlite3VdbeAddOp3(v, OP_Ne, regResult+i, iJump, regPrev+i);
          }else{
            sqlite3VdbeAddOp3(v, OP_Eq, regResult+i, iContinue, regPrev+i);
          }
          sqlite3VdbeChangeP4(v, -1, (const char *)pColl, P4_COLLSEQ);
          sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
        }
        assert( sqlite3VdbeCurrentAddr(v)==iJump );
        sqlite3VdbeAddOp3(v, OP_Copy, regResult, regPrev, nColumn-1);
        break;
      }

      case WHERE_DISTINCT_UNIQUE: {
        sqlite3VdbeChangeToNoop(v, pDistinct->addrTnct);
        break;
      }

      default: {
        assert( pDistinct->eTnctType==WHERE_DISTINCT_UNORDERED );
        codeDistinct(pParse, pDistinct->tabTnct, iContinue, nColumn, regResult);
        break;
      }
    }
    if( pOrderBy==0 ){
      codeOffset(v, p, iContinue);
    }
  }

  switch( eDest ){
    /* In this mode, write each query result to the key of the temporary
    ** table iParm.
    */
#ifndef SQLITE_OMIT_COMPOUND_SELECT
    case SRT_Union: {
      int r1;
      r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nColumn, r1);
      sqlite3VdbeAddOp2(v, OP_IdxInsert, iParm, r1);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

    /* Construct a record from the query result, but instead of
    ** saving that record, use it as a key to delete elements from
    ** the temporary table iParm.
    */
    case SRT_Except: {
      sqlite3VdbeAddOp3(v, OP_IdxDelete, iParm, regResult, nColumn);
      break;
    }
#endif

    /* Store the result as data using a unique key.
    */
    case SRT_Table:
    case SRT_EphemTab: {
      int r1 = sqlite3GetTempReg(pParse);
      testcase( eDest==SRT_Table );
      testcase( eDest==SRT_EphemTab );
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nColumn, r1);
      if( pOrderBy ){
        pushOntoSorter(pParse, pOrderBy, p, r1);
      }else{
        int r2 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_NewRowid, iParm, r2);
        sqlite3VdbeAddOp3(v, OP_Insert, iParm, r1, r2);
        sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

#ifndef SQLITE_OMIT_SUBQUERY
    /* If we are creating a set for an "expr IN (SELECT ...)" construct,
    ** then there should be a single item on the stack.  Write this
    ** item into the set table with bogus data.
    */
    case SRT_Set: {
      assert( nColumn==1 );
      pDest->affSdst =
                  sqlite3CompareAffinity(pEList->a[0].pExpr, pDest->affSdst);
      if( pOrderBy ){
        /* At first glance you would think we could optimize out the
        ** ORDER BY in this case since the order of entries in the set
        ** does not matter.  But there might be a LIMIT clause, in which
        ** case the order does matter */
        pushOntoSorter(pParse, pOrderBy, p, regResult);
      }else{
        int r1 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp4(v, OP_MakeRecord, regResult,1,r1, &pDest->affSdst, 1);
        sqlite3ExprCacheAffinityChange(pParse, regResult, 1);
        sqlite3VdbeAddOp2(v, OP_IdxInsert, iParm, r1);
        sqlite3ReleaseTempReg(pParse, r1);
      }
      break;
    }

    /* If any row exist in the result set, record that fact and abort.
    */
    case SRT_Exists: {
      sqlite3VdbeAddOp2(v, OP_Integer, 1, iParm);
      /* The LIMIT clause will terminate the loop for us */
      break;
    }

    /* If this is a scalar select that is part of an expression, then
    ** store the results in the appropriate memory cell and break out
    ** of the scan loop.
    */
    case SRT_Mem: {
      assert( nColumn==1 );
      if( pOrderBy ){
        pushOntoSorter(pParse, pOrderBy, p, regResult);
      }else{
        sqlite3ExprCodeMove(pParse, regResult, iParm, 1);
        /* The LIMIT clause will jump out of the loop for us */
      }
      break;
    }
#endif /* #ifndef SQLITE_OMIT_SUBQUERY */

    /* Send the data to the callback function or to a subroutine.  In the
    ** case of a subroutine, the subroutine itself is responsible for
    ** popping the data from the stack.
    */
    case SRT_Coroutine:
    case SRT_Output: {
      testcase( eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      if( pOrderBy ){
        int r1 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nColumn, r1);
        pushOntoSorter(pParse, pOrderBy, p, r1);
        sqlite3ReleaseTempReg(pParse, r1);
      }else if( eDest==SRT_Coroutine ){
        sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      }else{
        sqlite3VdbeAddOp2(v, OP_ResultRow, regResult, nColumn);
        sqlite3ExprCacheAffinityChange(pParse, regResult, nColumn);
      }
      break;
    }

#if !defined(SQLITE_OMIT_TRIGGER)
    /* Discard the results.  This is used for SELECT statements inside
    ** the body of a TRIGGER.  The purpose of such selects is to call
    ** user-defined functions that have side effects.  We do not care
    ** about the actual results of the select.
    */
    default: {
      assert( eDest==SRT_Discard );
      break;
    }
#endif
  }

  /* Jump to the end of the loop if the LIMIT is reached.  Except, if
  ** there is a sorter, in which case the sorter has already limited
  ** the output for us.
  */
  if( pOrderBy==0 && p->iLimit ){
    sqlite3VdbeAddOp3(v, OP_IfZero, p->iLimit, iBreak, -1);
  }
}